

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mldsa_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5f4c02::MLDSATest_WycheproofSignTests87_Test::TestBody
          (MLDSATest_WycheproofSignTests87_Test *this)

{
  code *local_28 [2];
  code *local_18;
  code *local_10;
  
  local_28[1] = (code *)0x0;
  local_28[0] = 
  MLDSAWycheproofSignTest<BCM_mldsa87_private_key,_&BCM_mldsa87_parse_private_key,_4627UL,_&BCM_mldsa87_sign_internal>
  ;
  local_10 = std::_Function_handler<void_(FileTest_*),_void_(*)(FileTest_*)>::_M_invoke;
  local_18 = std::_Function_handler<void_(FileTest_*),_void_(*)(FileTest_*)>::_M_manager;
  FileTestGTest("third_party/wycheproof_testvectors/mldsa_87_standard_sign_test.txt",
                (function<void_(FileTest_*)> *)local_28);
  std::_Function_base::~_Function_base((_Function_base *)local_28);
  return;
}

Assistant:

TEST(MLDSATest, WycheproofSignTests87) {
  FileTestGTest(
      "third_party/wycheproof_testvectors/mldsa_87_standard_sign_test.txt",
      MLDSAWycheproofSignTest<
          BCM_mldsa87_private_key, BCM_mldsa87_parse_private_key,
          BCM_MLDSA87_SIGNATURE_BYTES, BCM_mldsa87_sign_internal>);
}